

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O1

void __thiscall
draco::PointAttribute::Init
          (PointAttribute *this,Type attribute_type,int8_t num_components,DataType data_type,
          bool normalized,size_t num_attribute_values)

{
  DataBuffer *pDVar1;
  pointer pIVar2;
  int32_t iVar3;
  DataBuffer *this_00;
  pointer __p;
  DataBuffer *local_40;
  size_t local_38;
  
  local_38 = num_attribute_values;
  this_00 = (DataBuffer *)operator_new(0x28);
  DataBuffer::DataBuffer(this_00);
  local_40 = (DataBuffer *)0x0;
  pDVar1 = (this->attribute_buffer_)._M_t.
           super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
           super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
           super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
  (this->attribute_buffer_)._M_t.
  super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
  super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
  super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl = this_00;
  if (pDVar1 != (DataBuffer *)0x0) {
    std::default_delete<draco::DataBuffer>::operator()
              ((default_delete<draco::DataBuffer> *)&this->attribute_buffer_,pDVar1);
  }
  if (local_40 != (DataBuffer *)0x0) {
    std::default_delete<draco::DataBuffer>::operator()
              ((default_delete<draco::DataBuffer> *)&local_40,local_40);
  }
  pDVar1 = (this->attribute_buffer_)._M_t.
           super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
           super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
           super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
  iVar3 = DataTypeLength(data_type);
  GeometryAttribute::Init
            (&this->super_GeometryAttribute,attribute_type,pDVar1,num_components,data_type,
             normalized,(long)(iVar3 * num_components),0);
  Reset(this,local_38);
  this->identity_mapping_ = true;
  pIVar2 = (this->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  return;
}

Assistant:

void PointAttribute::Init(Type attribute_type, int8_t num_components,
                          DataType data_type, bool normalized,
                          size_t num_attribute_values) {
  attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  GeometryAttribute::Init(attribute_type, attribute_buffer_.get(),
                          num_components, data_type, normalized,
                          DataTypeLength(data_type) * num_components, 0);
  Reset(num_attribute_values);
  SetIdentityMapping();
}